

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_security_factory.c
# Opt level: O0

int iothub_security_set_symmetric_key_info(char *registration_name,char *symmetric_key)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  char *temp_name;
  char *temp_key;
  LOGGER_LOG l;
  char *pcStack_18;
  int result;
  char *symmetric_key_local;
  char *registration_name_local;
  
  pcStack_18 = symmetric_key;
  symmetric_key_local = registration_name;
  if ((registration_name == (char *)0x0) || (symmetric_key == (char *)0x0)) {
    temp_key = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)temp_key != (LOGGER_LOG)0x0) {
      (*(code *)temp_key)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
                          ,"iothub_security_set_symmetric_key_info",0x78,1,
                          "Invalid parameter specified reg_name: %p, symm_key: %p",
                          symmetric_key_local,pcStack_18);
    }
    l._4_4_ = 0x79;
  }
  else {
    iVar1 = mallocAndStrcpy_s((char **)&l_1,registration_name);
    if (iVar1 == 0) {
      iVar1 = mallocAndStrcpy_s(&temp_name,pcStack_18);
      if (iVar1 == 0) {
        if (g_symm_key != (char *)0x0) {
          free(g_symm_key);
        }
        if (g_symm_key_reg_name != (char *)0x0) {
          free(g_symm_key_reg_name);
        }
        g_symm_key_reg_name = (char *)l_1;
        g_symm_key = temp_name;
        pcVar3 = prov_dev_get_symmetric_key();
        if ((pcVar3 == (char *)0x0) ||
           (pcVar3 = prov_dev_get_symm_registration_name(), pcVar3 == (char *)0x0)) {
          iVar1 = prov_dev_set_symmetric_key_info(g_symm_key_reg_name,g_symm_key);
          if (iVar1 == 0) {
            l._4_4_ = 0;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
                        ,"iothub_security_set_symmetric_key_info",0x9c,1,
                        "Failure syncing dps & IoThub key information");
            }
            l._4_4_ = 0x9d;
          }
        }
        else {
          l._4_4_ = 0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
                    ,"iothub_security_set_symmetric_key_info",0x86,1,
                    "Failure allocating symmetric key");
        }
        free(l_1);
        l._4_4_ = 0x88;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
                  ,"iothub_security_set_symmetric_key_info",0x81,1,
                  "Failure allocating registration name");
      }
      l._4_4_ = 0x82;
    }
  }
  return l._4_4_;
}

Assistant:

int iothub_security_set_symmetric_key_info(const char* registration_name, const char* symmetric_key)
{
    int result;
    if (registration_name == NULL || symmetric_key == NULL)
    {
        LogError("Invalid parameter specified reg_name: %p, symm_key: %p", registration_name, symmetric_key);
        result = MU_FAILURE;
    }
    else
    {
        char* temp_key;
        char* temp_name;
        if (mallocAndStrcpy_s(&temp_name, registration_name) != 0)
        {
            LogError("Failure allocating registration name");
            result = MU_FAILURE;
        }
        else if (mallocAndStrcpy_s(&temp_key, symmetric_key) != 0)
        {
            LogError("Failure allocating symmetric key");
            free(temp_name);
            result = MU_FAILURE;
        }
        else
        {
            if (g_symm_key != NULL)
            {
                free(g_symm_key);
            }
            if (g_symm_key_reg_name != NULL)
            {
                free(g_symm_key_reg_name);
            }
            g_symm_key_reg_name = temp_name;
            g_symm_key = temp_key;

            // Sync iothub with dps
            if (prov_dev_get_symmetric_key() == NULL || prov_dev_get_symm_registration_name() == NULL)
            {
                if (prov_dev_set_symmetric_key_info(g_symm_key_reg_name, g_symm_key) != 0)
                {
                    LogError("Failure syncing dps & IoThub key information");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
            else
            {
                result = 0;
            }
        }
    }
    return result;
}